

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O2

void bhf::ads::ParseDwordData(RegistryEntry *value,char **it,istream *param_3,size_t *lineNumber)

{
  char *pcVar1;
  ostream *poVar2;
  runtime_error *prVar3;
  long lVar4;
  uint32_t v;
  string local_360 [32];
  stringstream converter;
  long local_330 [3];
  uint auStack_318 [88];
  stringstream ss_1;
  ostream local_1a8 [376];
  
  if (**it == '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&converter);
    if (*lineNumber == 0xffffffffffffffff) {
      poVar2 = std::operator<<((ostream *)local_330,"Invalid network data: ");
      poVar2 = std::operator<<(poVar2,"invalid dword hex character length (no data)");
    }
    else {
      poVar2 = std::operator<<((ostream *)local_330,"Invalid file format: ");
      poVar2 = std::operator<<(poVar2,"invalid dword hex character length (no data)");
      poVar2 = std::operator<<(poVar2," in line ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    std::operator<<(poVar2,'\n');
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,(string *)&ss_1);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&converter);
  pcVar1 = *it;
  for (lVar4 = -8; lVar4 != 0; lVar4 = lVar4 + 1) {
    if (*pcVar1 == '\0') goto LAB_00127fba;
    *(uint *)((long)auStack_318 + *(long *)(local_330[0] + -0x18)) =
         *(uint *)((long)auStack_318 + *(long *)(local_330[0] + -0x18)) & 0xffffffb5 | 8;
    std::operator<<((ostream *)local_330,*pcVar1);
    pcVar1 = *it + 1;
    *it = pcVar1;
  }
  if (*pcVar1 != '\0') {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss_1);
    if (*lineNumber == 0xffffffffffffffff) {
      poVar2 = std::operator<<(local_1a8,"Invalid network data: ");
      poVar2 = std::operator<<(poVar2,"invalid dword hex character length (too long)");
    }
    else {
      poVar2 = std::operator<<(local_1a8,"Invalid file format: ");
      poVar2 = std::operator<<(poVar2,"invalid dword hex character length (too long)");
      poVar2 = std::operator<<(poVar2," in line ");
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    }
    std::operator<<(poVar2,'\n');
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringbuf::str();
    std::runtime_error::runtime_error(prVar3,local_360);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_00127fba:
  std::istream::_M_extract<unsigned_int>((uint *)&converter);
  RegistryEntry::PushData<unsigned_int>(value,0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&converter);
  return;
}

Assistant:

static void ParseDwordData(bhf::ads::RegistryEntry& value, const char*& it, std::istream& /*input*/, size_t& lineNumber)
{
    if ('\0' == *it) {
        PARSING_EXCEPTION("invalid dword hex character length (no data)");
    }

    uint32_t v = 0;
    std::stringstream converter;
    for (auto i = 2 * sizeof(v); i; --i, ++it) {
        if ('\0' == *it) {
            break;
        }
        converter << std::hex << *it;
    }
    if ('\0' != *it) {
        PARSING_EXCEPTION("invalid dword hex character length (too long)");
    }

    converter >> v;
    value.PushData(v);
}